

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<double,_toml::error_info> * toml::read_dec_float<double>(string *str,source_location *src)

{
  byte bVar1;
  source_location *in_RDX;
  string *in_RSI;
  result<double,_toml::error_info> *in_RDI;
  success<double> s;
  istringstream iss;
  double val;
  failure_type *in_stack_fffffffffffffc88;
  source_location *this;
  undefined7 in_stack_fffffffffffffca8;
  result<double,_toml::error_info> *__a;
  istringstream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  allocator<char> local_321 [9];
  error_info *in_stack_fffffffffffffce8;
  allocator<char> local_281 [201];
  string *in_stack_fffffffffffffe48;
  source_location *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  istringstream local_1a0 [384];
  double local_20 [4];
  
  this_00 = local_1a0;
  __a = in_RDI;
  std::__cxx11::istringstream::istringstream(this_00,in_RSI,_S_in);
  std::istream::operator>>(this_00,local_20);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    s = ok<double&>((double *)in_stack_fffffffffffffc88);
    result<double,_toml::error_info>::result(in_RDI,(success_type)s.value);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,(char *)this_00,(allocator<char> *)__a);
    source_location::source_location
              (in_RDX,(source_location *)CONCAT17(bVar1,in_stack_fffffffffffffca8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,(char *)this_00,(allocator<char> *)__a);
    make_error_info<>(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48)
    ;
    this = (source_location *)(local_281 + 0x79);
    err<toml::error_info>(in_stack_fffffffffffffce8);
    result<double,_toml::error_info>::result
              ((result<double,_toml::error_info> *)this,in_stack_fffffffffffffc88);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x74793e);
    error_info::~error_info((error_info *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::allocator<char>::~allocator(local_321);
    source_location::~source_location(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::allocator<char>::~allocator(local_281);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __a;
}

Assistant:

result<T, error_info>
read_dec_float(const std::string& str, const source_location src)
{
    T val;
    std::istringstream iss(str);
    iss >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_floating: "
            "failed to read floating point value from stream",
            std::move(src), "here"));
    }
    return ok(val);
}